

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_io_plugin.c
# Opt level: O0

void nsh_io_erase_last_char(void)

{
  putchar(8);
  putchar(0x20);
  putchar(8);
  return;
}

Assistant:

void nsh_io_erase_last_char(void)
{
    // go back to one character
    putchar('\b');
    // overwrite the char with whitespace
    putchar(' ');
    // go back to the now removed char position
    putchar('\b');
}